

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O3

int ZPdr_ManDown(Pdr_Man_t *p,int k,Pdr_Set_t **ppCube,Pdr_Set_t *pPred,Hash_Int_t *keep,
                Pdr_Set_t *pIndCube,int *added)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  Pdr_Set_t *pPVar5;
  long lVar6;
  Pdr_Set_t *pPVar7;
  byte bVar8;
  char *__function;
  uint uVar9;
  undefined4 in_register_00000034;
  char *__file;
  Pdr_Man_t *pPVar10;
  FILE *pFVar11;
  char *__assertion;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  Pdr_Set_t *pCubeMin;
  Pdr_Set_t *local_70;
  ulong local_68;
  uint local_5c;
  Pdr_Set_t *local_58;
  Pdr_Set_t *local_50;
  int local_48;
  uint local_44;
  Hash_Int_t *local_40;
  Pdr_Set_t **local_38;
  
  local_68 = CONCAT44(in_register_00000034,k);
  local_44 = p->vSolvers->nSize - 1;
  iVar12 = k + -1;
  local_70 = pPred;
  local_48 = iVar12;
  local_40 = keep;
  local_38 = ppCube;
  do {
    if (1 < (int)local_68) {
      local_5c = 0;
      iVar4 = 0;
      while( true ) {
        if (((iVar4 != 0) || (p->pPars->fCtgs == 0)) || (2 < local_5c)) goto LAB_005ecf22;
        pPVar5 = Pdr_SetDup(local_70);
        iVar4 = Pdr_SetIsInit(pPVar5,-1);
        if (iVar4 != 0) break;
        local_50 = pPVar5;
        if (*added == 0) {
          iVar4 = 1;
          do {
            Pdr_ManSolverAddClause(p,iVar4,pIndCube);
            bVar15 = iVar4 != k;
            iVar4 = iVar4 + 1;
          } while (bVar15);
          *added = 1;
        }
        pPVar5 = local_50;
        iVar4 = Pdr_ManCheckCube(p,iVar12,local_50,(Pdr_Set_t **)0x0,p->pPars->nConfLimit,0,1);
        if (iVar4 != 1) break;
        pPVar5 = Pdr_ManReduceClause(p,iVar12,pPVar5);
        if (pPVar5 == (Pdr_Set_t *)0x0) {
          local_58 = pPVar5;
          pPVar5 = Pdr_SetDup(local_50);
        }
        uVar9 = local_44;
        uVar14 = local_68 & 0xffffffff;
        uVar3 = local_68;
        local_58 = pPVar5;
        if ((int)local_68 < (int)local_44) {
          do {
            uVar14 = uVar3;
            iVar12 = Pdr_ManCheckCube(p,(int)uVar14,pPVar5,(Pdr_Set_t **)0x0,0,0,1);
            if (iVar12 == 0) goto LAB_005ecd68;
            uVar13 = (int)uVar14 + 1;
            uVar3 = (ulong)uVar13;
          } while (uVar9 != uVar13);
          uVar14 = (ulong)uVar9;
LAB_005ecd68:
          iVar12 = (int)uVar14 + -1;
        }
        pPVar10 = p;
        iVar12 = ZPdr_ManSimpleMic(p,iVar12,&local_58);
        if (iVar12 == -1) {
          __assert_fail("micResult != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                        ,0x19c,
                        "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                       );
        }
        iVar12 = (int)uVar14;
        pPVar5 = local_58;
        if (p->pPars->fVeryVerbose != 0) {
          Abc_Print((int)pPVar10,"Adding cube ");
          pPVar5 = local_58;
          pFVar11 = _stdout;
          Pdr_SetPrint(_stdout,local_58,p->pAig->nRegs,(Vec_Int_t *)0x0);
          Abc_Print((int)pFVar11," to frame %d.\n",uVar14 & 0xffffffff);
        }
        if (0 < pPVar5->nLits) {
          lVar6 = 0;
          do {
            uVar9 = *(uint *)(&pPVar5->field_0x14 + lVar6 * 4);
            if ((int)uVar9 < 0) {
              __assert_fail("pCubeMin->Lits[i] >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                            ,0x1a8,
                            "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                           );
            }
            uVar13 = uVar9 >> 1;
            if (p->pAig->nRegs <= (int)uVar13) {
              __assertion = "(pCubeMin->Lits[i] / 2) < Aig_ManRegNum(p->pAig)";
              __file = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
              ;
              __function = 
              "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
              ;
LAB_005ed0a8:
              __assert_fail(__assertion,__file,0x1a9,__function);
            }
            uVar1 = p->vPrio->nSize;
            if ((int)uVar1 <= (int)uVar13) {
              __assertion = "i >= 0 && i < p->nSize";
              __file = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
              ;
              __function = "int Vec_IntEntry(Vec_Int_t *, int)";
              goto LAB_005ed0a8;
            }
            piVar2 = p->vPrio->pArray;
            bVar8 = (byte)p->nPrioShift;
            if (piVar2[uVar13] >> (bVar8 & 0x1f) == 0) {
              p->nAbsFlops = p->nAbsFlops + 1;
              uVar9 = *(uint *)(&pPVar5->field_0x14 + lVar6 * 4);
            }
            if (((int)uVar9 < -1) || (uVar1 <= (uint)((int)uVar9 / 2))) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar2 = piVar2 + (uint)((int)uVar9 / 2);
            *piVar2 = *piVar2 + (1 << (bVar8 & 0x1f));
            lVar6 = lVar6 + 1;
          } while (lVar6 < pPVar5->nLits);
        }
        Vec_VecPush(p->vClauses,iVar12,pPVar5);
        p->nCubes = p->nCubes + 1;
        if (0 < iVar12) {
          iVar4 = 1;
          do {
            Pdr_ManSolverAddClause(p,iVar4,pPVar5);
            bVar15 = iVar4 != iVar12;
            iVar4 = iVar4 + 1;
          } while (bVar15);
        }
        Pdr_SetDeref(local_70);
        ppCube = local_38;
        iVar4 = Pdr_ManCheckCube(p,(int)local_68,*local_38,&local_70,p->pPars->nConfLimit,0,1);
        if (iVar4 < 0) {
          __assert_fail("RetValue >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                        ,0x1b6,
                        "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                       );
        }
        local_5c = local_5c + 1;
        Pdr_SetDeref(local_50);
        iVar12 = local_48;
        if (iVar4 == 1) {
          return 1;
        }
      }
      Pdr_SetDeref(pPVar5);
    }
LAB_005ecf22:
    if (p->pPars->fVeryVerbose != 0) {
      puts("Cube:");
      ZPdr_SetPrint(*ppCube);
      puts("\nPred:");
      ZPdr_SetPrint(local_70);
    }
    pPVar5 = *ppCube;
    pPVar7 = ZPdr_SetIntersection(pPVar5,local_70,local_40);
    *ppCube = pPVar7;
    Pdr_SetDeref(pPVar5);
    Pdr_SetDeref(local_70);
    pPVar5 = *ppCube;
    if (pPVar5 == (Pdr_Set_t *)0x0) {
      return 0;
    }
    if (p->pPars->fVeryVerbose != 0) {
      puts("Intersection:");
      ZPdr_SetPrint(*ppCube);
      pPVar5 = *ppCube;
    }
    iVar4 = Pdr_SetIsInit(pPVar5,-1);
    if (iVar4 != 0) {
      if (p->pPars->fVeryVerbose == 0) {
        return 0;
      }
      puts("Failed initiation");
      return 0;
    }
    iVar4 = Pdr_ManCheckCube(p,(int)local_68,*ppCube,&local_70,p->pPars->nConfLimit,0,1);
    if (iVar4 != 0) {
      if (iVar4 != -1) {
        return 1;
      }
      return -1;
    }
    if ((*ppCube)->nLits == 1) {
      Pdr_SetDeref(local_70);
      return 0;
    }
  } while( true );
}

Assistant:

int ZPdr_ManDown( Pdr_Man_t * p, int k, Pdr_Set_t ** ppCube, Pdr_Set_t * pPred, Hash_Int_t * keep, Pdr_Set_t * pIndCube, int * added )
{
    int RetValue = 0, CtgRetValue, i, ctgAttempts, l, micResult;
    int kMax = Vec_PtrSize(p->vSolvers)-1;
    Pdr_Set_t * pCubeTmp, * pCubeMin, * pCtg;
    while ( RetValue == 0 )
    {
        ctgAttempts = 0;
        while ( p->pPars->fCtgs && RetValue == 0 && k > 1 && ctgAttempts < 3 )
        {
            pCtg = Pdr_SetDup( pPred );
            //Check CTG for inductiveness
            if ( Pdr_SetIsInit( pCtg, -1 ) )
            {
                Pdr_SetDeref( pCtg );
                break;
            }
            if (*added == 0)
            {
                for ( i = 1; i <= k; i++ )
                    Pdr_ManSolverAddClause( p, i, pIndCube);
                *added = 1;
            }
            ctgAttempts++;
            CtgRetValue = Pdr_ManCheckCube( p, k-1, pCtg, NULL, p->pPars->nConfLimit, 0, 1 );
            if ( CtgRetValue != 1 )
            {
                Pdr_SetDeref( pCtg );
                break;
            }
            pCubeMin = Pdr_ManReduceClause( p, k-1, pCtg );
            if ( pCubeMin == NULL )
                pCubeMin = Pdr_SetDup ( pCtg );

            for ( l = k; l < kMax; l++ )
                if ( !Pdr_ManCheckCube( p, l, pCubeMin, NULL, 0, 0, 1 ) )
                    break;
            micResult = ZPdr_ManSimpleMic( p, l-1, &pCubeMin );
            assert ( micResult != -1 );

            // add new clause
            if ( p->pPars->fVeryVerbose )
            {
                Abc_Print( 1, "Adding cube " );
                Pdr_SetPrint( stdout, pCubeMin, Aig_ManRegNum(p->pAig), NULL );
                Abc_Print( 1, " to frame %d.\n", l );
            }
            // set priority flops
            for ( i = 0; i < pCubeMin->nLits; i++ )
            {
                assert( pCubeMin->Lits[i] >= 0 );
                assert( (pCubeMin->Lits[i] / 2) < Aig_ManRegNum(p->pAig) );
                if ( (Vec_IntEntry(p->vPrio, pCubeMin->Lits[i] / 2) >> p->nPrioShift) == 0 )
                    p->nAbsFlops++;
                Vec_IntAddToEntry( p->vPrio, pCubeMin->Lits[i] / 2, 1 << p->nPrioShift );
            }

            Vec_VecPush( p->vClauses, l, pCubeMin );   // consume ref
            p->nCubes++;
            // add clause
            for ( i = 1; i <= l; i++ )
                Pdr_ManSolverAddClause( p, i, pCubeMin );
            Pdr_SetDeref( pPred );
            RetValue = Pdr_ManCheckCube( p, k, *ppCube, &pPred, p->pPars->nConfLimit, 0, 1 );
            assert( RetValue >= 0 );
            Pdr_SetDeref( pCtg );
            if ( RetValue == 1 )
            {
                //printf ("IT'S A ONE\n");
                return 1;
            }
        }

        //join
        if ( p->pPars->fVeryVerbose )
        {
            printf("Cube:\n");
            ZPdr_SetPrint( *ppCube );
            printf("\nPred:\n");
            ZPdr_SetPrint( pPred );
        }
        *ppCube = ZPdr_SetIntersection( pCubeTmp = *ppCube, pPred, keep );
        Pdr_SetDeref( pCubeTmp );
        Pdr_SetDeref( pPred );
        if ( *ppCube == NULL )
            return 0;
        if ( p->pPars->fVeryVerbose )
        {
            printf("Intersection:\n");
            ZPdr_SetPrint( *ppCube );
        }
        if ( Pdr_SetIsInit( *ppCube, -1 ) )
        {
            if ( p->pPars->fVeryVerbose )
                printf ("Failed initiation\n");
            return 0;
        }
        RetValue = Pdr_ManCheckCube( p, k, *ppCube, &pPred, p->pPars->nConfLimit, 0, 1 );
        if ( RetValue == -1 )
            return -1;
        if ( RetValue == 1 )
        {
            //printf ("*********IT'S A ONE\n");
            break;
        }
        if ( RetValue == 0 && (*ppCube)->nLits == 1)
        {
            Pdr_SetDeref( pPred ); // fixed memory leak
            // A workaround for the incomplete assignment returned by the SAT
            // solver
            return 0;
        }
    }
    return 1;
}